

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O3

int run_test_udp_connect(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar2;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_udp_t *loop;
  uv_loop_t *puVar3;
  long lVar4;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_udp_t *addr;
  sockaddr_in *psVar5;
  code *pcVar6;
  uv_buf_t *puVar7;
  char *pcVar8;
  bool bVar9;
  int addrlen;
  sockaddr_in ext_addr;
  sockaddr_in tmp_addr;
  uv_udp_send_t req;
  int local_16c;
  undefined1 local_168 [32];
  
  pcVar8 = "0.0.0.0";
  addr = (uv_udp_t *)0x23a3;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&lo_addr);
  if (iVar1 == 0) {
    loop = (uv_udp_t *)uv_default_loop();
    addr = &server;
    iVar1 = uv_udp_init((uv_loop_t *)loop,&server);
    if (iVar1 != 0) goto LAB_001768eb;
    loop = &server;
    psVar5 = &lo_addr;
    iVar1 = uv_udp_bind(&server,(sockaddr *)&lo_addr,0);
    addr = (uv_udp_t *)psVar5;
    if (iVar1 != 0) goto LAB_001768f0;
    loop = &server;
    pcVar6 = alloc_cb;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
    addr = (uv_udp_t *)pcVar6;
    if (iVar1 != 0) goto LAB_001768f5;
    loop = (uv_udp_t *)uv_default_loop();
    addr = &client;
    iVar1 = uv_udp_init((uv_loop_t *)loop,&client);
    if (iVar1 != 0) goto LAB_001768fa;
    buf = uv_buf_init("EXIT",4);
    pcVar8 = "8.8.8.8";
    addr = (uv_udp_t *)0x23a3;
    iVar1 = uv_ip4_addr("8.8.8.8",0x23a3,(sockaddr_in *)local_168);
    loop = (uv_udp_t *)pcVar8;
    if (iVar1 != 0) goto LAB_001768ff;
    loop = (uv_udp_t *)0x1a4b3a;
    addr = (uv_udp_t *)0x23a3;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&lo_addr);
    if (iVar1 != 0) goto LAB_00176904;
    loop = &client;
    psVar5 = &lo_addr;
    iVar1 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
    addr = (uv_udp_t *)psVar5;
    if (iVar1 != 0) goto LAB_00176909;
    loop = &client;
    addr = (uv_udp_t *)local_168;
    iVar1 = uv_udp_connect(&client,(sockaddr *)addr);
    if (iVar1 != -0x6a) goto LAB_0017690e;
    local_16c = 0x10;
    loop = &client;
    addr = (uv_udp_t *)(local_168 + 0x10);
    iVar1 = uv_udp_getpeername(&client,(sockaddr *)addr,&local_16c);
    if (iVar1 != 0) goto LAB_00176913;
    loop = &client;
    puVar7 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
    addr = (uv_udp_t *)puVar7;
    if (iVar1 != -0x6a) goto LAB_00176918;
    loop = &client;
    puVar7 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
    addr = (uv_udp_t *)puVar7;
    if (iVar1 != 4) goto LAB_0017691d;
    loop = &client;
    puVar7 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)local_168);
    addr = (uv_udp_t *)puVar7;
    if (iVar1 != -0x6a) goto LAB_00176922;
    loop = &client;
    addr = (uv_udp_t *)0x0;
    iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
    if (iVar1 != 0) goto LAB_00176927;
    loop = &client;
    addr = (uv_udp_t *)0x0;
    iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
    if (iVar1 != -0x6b) goto LAB_0017692c;
    local_16c = 0x10;
    loop = &client;
    addr = (uv_udp_t *)(local_168 + 0x10);
    iVar1 = uv_udp_getpeername(&client,(sockaddr *)addr,&local_16c);
    if (iVar1 != -0x6b) goto LAB_00176931;
    loop = &client;
    puVar7 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
    addr = (uv_udp_t *)puVar7;
    if (iVar1 != 4) goto LAB_00176936;
    loop = &client;
    puVar7 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
    addr = (uv_udp_t *)puVar7;
    if (iVar1 != -0x59) goto LAB_0017693b;
    loop = &client;
    psVar5 = &lo_addr;
    iVar1 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
    addr = (uv_udp_t *)psVar5;
    if (iVar1 != 0) goto LAB_00176940;
    addr = &client;
    loop = (uv_udp_t *)&stack0xfffffffffffffeb8;
    iVar1 = uv_udp_send((uv_udp_send_t *)loop,&client,&buf,1,(sockaddr *)&lo_addr,cl_send_cb);
    if (iVar1 != -0x6a) goto LAB_00176945;
    addr = &client;
    loop = (uv_udp_t *)&stack0xfffffffffffffeb8;
    iVar1 = uv_udp_send((uv_udp_send_t *)loop,&client,&buf,1,(sockaddr *)0x0,cl_send_cb);
    if (iVar1 != 0) goto LAB_0017694a;
    loop = (uv_udp_t *)uv_default_loop();
    addr = (uv_udp_t *)0x0;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (close_cb_called != 2) goto LAB_0017694f;
    if (sv_recv_cb_called != 4) goto LAB_00176954;
    if (cl_send_cb_called != 2) goto LAB_00176959;
    if (client.send_queue_size != 0) goto LAB_0017695e;
    if (server.send_queue_size != 0) goto LAB_00176963;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    addr = (uv_udp_t *)0x0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    loop = (uv_udp_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_udp_connect_cold_1();
    loop = (uv_udp_t *)pcVar8;
LAB_001768eb:
    run_test_udp_connect_cold_2();
LAB_001768f0:
    run_test_udp_connect_cold_3();
LAB_001768f5:
    run_test_udp_connect_cold_4();
LAB_001768fa:
    run_test_udp_connect_cold_5();
LAB_001768ff:
    run_test_udp_connect_cold_6();
LAB_00176904:
    run_test_udp_connect_cold_7();
LAB_00176909:
    run_test_udp_connect_cold_8();
LAB_0017690e:
    run_test_udp_connect_cold_9();
LAB_00176913:
    run_test_udp_connect_cold_10();
LAB_00176918:
    run_test_udp_connect_cold_11();
LAB_0017691d:
    run_test_udp_connect_cold_12();
LAB_00176922:
    run_test_udp_connect_cold_13();
LAB_00176927:
    run_test_udp_connect_cold_14();
LAB_0017692c:
    run_test_udp_connect_cold_15();
LAB_00176931:
    run_test_udp_connect_cold_16();
LAB_00176936:
    run_test_udp_connect_cold_17();
LAB_0017693b:
    run_test_udp_connect_cold_18();
LAB_00176940:
    run_test_udp_connect_cold_19();
LAB_00176945:
    run_test_udp_connect_cold_20();
LAB_0017694a:
    run_test_udp_connect_cold_21();
LAB_0017694f:
    run_test_udp_connect_cold_22();
LAB_00176954:
    run_test_udp_connect_cold_23();
LAB_00176959:
    run_test_udp_connect_cold_24();
LAB_0017695e:
    run_test_udp_connect_cold_25();
LAB_00176963:
    run_test_udp_connect_cold_26();
  }
  run_test_udp_connect_cold_27();
  lVar4 = CONCAT71(0x52fe,loop == &client || loop == &server);
  if (loop == &client || loop == &server) {
    if (addr < (uv_udp_t *)0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return extraout_EAX;
    }
  }
  else {
    alloc_cb_cold_1();
  }
  alloc_cb_cold_2();
  if ((long)addr < 1) {
    return extraout_EAX_00;
  }
  if (addr == (uv_udp_t *)0x4) {
    if (lVar4 == 0) goto LAB_00176a0f;
    if (*(int *)*extraout_RDX_00 == 0x54495845) {
      sv_recv_cb_called = sv_recv_cb_called + 1;
      if (sv_recv_cb_called != 4) {
        return sv_recv_cb_called;
      }
      uv_close((uv_handle_t *)&server,close_cb);
      uv_close((uv_handle_t *)&client,close_cb);
      return extraout_EAX_01;
    }
  }
  else {
    sv_recv_cb_cold_1();
LAB_00176a0f:
    sv_recv_cb_cold_3();
  }
  iVar1 = (int)addr;
  sv_recv_cb_cold_2();
  if ((uv_loop_t *)loop == (uv_loop_t *)0x0) {
    cl_send_cb_cold_5();
LAB_00176adb:
    cl_send_cb_cold_1();
LAB_00176ae0:
    cl_send_cb_cold_2();
    puVar3 = (uv_loop_t *)loop;
  }
  else {
    if (iVar1 != 0) goto LAB_00176adb;
    if (*(uv_udp_t **)&((uv_loop_t *)loop)->backend_fd != &client &&
        *(uv_udp_t **)&((uv_loop_t *)loop)->backend_fd != &server) goto LAB_00176ae0;
    iVar1 = cl_send_cb_called + 1;
    bVar9 = cl_send_cb_called != 0;
    iVar2 = cl_send_cb_called;
    cl_send_cb_called = iVar1;
    if (bVar9) {
LAB_00176ace:
      return iVar2;
    }
    uv_udp_connect(&client,(sockaddr *)0x0);
    puVar3 = (uv_loop_t *)loop;
    iVar1 = uv_udp_send((uv_udp_send_t *)loop,&client,&buf,1,(sockaddr *)0x0,cl_send_cb);
    if (iVar1 == -0x59) {
      iVar2 = uv_udp_send((uv_udp_send_t *)loop,&client,&buf,1,(sockaddr *)&lo_addr,cl_send_cb);
      if (iVar2 == 0) goto LAB_00176ace;
      goto LAB_00176aea;
    }
  }
  loop = (uv_udp_t *)puVar3;
  cl_send_cb_cold_3();
LAB_00176aea:
  cl_send_cb_cold_4();
  if (loop == &client || loop == &server) {
    iVar1 = uv_is_closing((uv_handle_t *)loop);
    if (iVar1 != 0) {
      close_cb_called = close_cb_called + 1;
      return extraout_EAX_02;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 == 0) {
    uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
    return extraout_EAX_03;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_connect) {
  uv_udp_send_t req;
  struct sockaddr_in ext_addr;
  struct sockaddr_in tmp_addr;
  int r;
  int addrlen;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &lo_addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &lo_addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init("EXIT", 4);

  ASSERT(0 == uv_ip4_addr("8.8.8.8", TEST_PORT, &ext_addr));
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &lo_addr));

  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 0);
  r = uv_udp_connect(&client, (const struct sockaddr*) &ext_addr);
  ASSERT(r == UV_EISCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT(r == 0);

  /* To send messages in connected UDP sockets addr must be NULL */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT(r == UV_EISCONN);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT(r == 4);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &ext_addr);
  ASSERT(r == UV_EISCONN);

  r = uv_udp_connect(&client, NULL);
  ASSERT(r == 0);
  r = uv_udp_connect(&client, NULL);
  ASSERT(r == UV_ENOTCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT(r == UV_ENOTCONN);

  /* To send messages in disconnected UDP sockets addr must be set */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 4);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT(r == UV_EDESTADDRREQ);


  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 0);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &lo_addr,
                  cl_send_cb);
  ASSERT(r == UV_EISCONN);
  r = uv_udp_send(&req, &client, &buf, 1, NULL, cl_send_cb);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);
  ASSERT(sv_recv_cb_called == 4);
  ASSERT(cl_send_cb_called == 2);

  ASSERT(client.send_queue_size == 0);
  ASSERT(server.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}